

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keypoints.cpp
# Opt level: O3

bool __thiscall ary::KeypointPlaneLocalizer::add(KeypointPlaneLocalizer *this,Mat *image,float size)

{
  Mat *pMVar1;
  element_type *peVar2;
  bool bVar3;
  char cVar4;
  undefined8 uVar5;
  value_type *__x;
  bool bVar6;
  Point2f PVar7;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> keypoints;
  Mat tmp_image1;
  Mat tmp_image2;
  Mat descriptors;
  _InputArray local_270;
  KeypointPlaneLocalizer *local_258;
  _InputArray local_250;
  value_type *local_238;
  value_type *pvStack_230;
  undefined8 local_228;
  undefined1 local_218 [8];
  undefined4 uStack_210;
  undefined4 uStack_20c;
  _InputArray local_200;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  Mat local_1d0;
  KeypointPlaneModel local_170;
  Mat local_f0;
  Mat local_90;
  
  local_218._4_4_ = in_XMM0_Db;
  local_218._0_4_ = size;
  uStack_210 = in_XMM0_Dc;
  uStack_20c = in_XMM0_Dd;
  local_258 = this;
  KeypointPlaneModel::KeypointPlaneModel(&local_170);
  cv::Mat::Mat(&local_1d0);
  cv::Mat::Mat(&local_f0);
  cv::Mat::operator=(&local_1d0,image);
  local_170.size.width =
       (float)(int)((ulong)*(undefined8 *)local_1d0.size.p >> 0x20) * (float)local_218._0_4_;
  local_170.size.height = (float)(int)*(undefined8 *)local_1d0.size.p * (float)local_218._0_4_;
  do {
    cv::Mat::Mat(&local_90);
    local_228 = 0;
    local_238 = (value_type *)0x0;
    pvStack_230 = (value_type *)0x0;
    peVar2 = (local_258->detector).super_shared_ptr<cv::Feature2D>.
             super___shared_ptr<cv::Feature2D,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_270.sz.width = 0;
    local_270.sz.height = 0;
    local_270.flags = 0x1010000;
    local_270.obj = &local_1d0;
    uVar5 = cv::noArray();
    (**(code **)(*(long *)peVar2 + 0x40))(peVar2,&local_270,&local_238,uVar5);
    peVar2 = (local_258->detector).super_shared_ptr<cv::Feature2D>.
             super___shared_ptr<cv::Feature2D,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_270.sz.width = 0;
    local_270.sz.height = 0;
    local_270.flags = 0x1010000;
    local_270.obj = &local_1d0;
    local_250.sz.width = 0;
    local_250.sz.height = 0;
    local_250.flags = 0x2010000;
    local_250.obj = &local_90;
    (**(code **)(*(long *)peVar2 + 0x50))(peVar2,&local_270,&local_238,&local_250);
    local_1e8 = *(undefined8 *)local_1d0.size.p;
    uStack_1e0 = 0;
    pMVar1 = &local_170.descriptors;
    cVar4 = cv::Mat::empty();
    local_270.obj = pMVar1;
    if (cVar4 == '\0') {
      local_270.sz.width = 0;
      local_270.sz.height = 0;
      local_270.flags = 0x1010000;
      local_250.sz.width = 0;
      local_250.sz.height = 0;
      local_250.flags = 0x1010000;
      local_200.sz.width = 0;
      local_200.sz.height = 0;
      local_200.flags = 0x2010000;
      local_250.obj = &local_90;
      local_200.obj = pMVar1;
      cv::vconcat(&local_270,&local_250,(_OutputArray *)&local_200);
    }
    else {
      local_270.sz.width = 0;
      local_270.sz.height = 0;
      local_270.flags = 0x2010000;
      cv::Mat::copyTo((_OutputArray *)&local_90);
    }
    if (local_238 != pvStack_230) {
      auVar8._8_4_ = (float)(int)uStack_1e0;
      auVar8._12_4_ = (float)uStack_1e0._4_4_;
      auVar8._4_4_ = (float)(int)local_1e8;
      auVar8._0_4_ = (float)local_1e8._4_4_;
      auVar9._8_8_ = 0;
      auVar9._0_4_ = local_170.size.width;
      auVar9._4_4_ = local_170.size.height;
      _local_218 = divps(auVar9,auVar8);
      __x = local_238;
      do {
        PVar7.x = (__x->pt).x * (float)local_218._0_4_;
        PVar7.y = (__x->pt).y * (float)local_218._4_4_;
        __x->pt = PVar7;
        std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::push_back
                  (&local_170.keypoints,__x);
        __x = __x + 1;
      } while (__x != pvStack_230);
    }
    bVar6 = local_258->type != AKAZE;
    bVar3 = 29999 < local_1e8._4_4_ * (int)local_1e8;
    if (bVar3 && bVar6) {
      local_270.sz.width = 0;
      local_270.sz.height = 0;
      local_270.flags = 0x1010000;
      local_250.sz.width = 0;
      local_250.sz.height = 0;
      local_250.flags = 0x2010000;
      local_200.flags = 0;
      local_200._4_4_ = 0;
      local_270.obj = &local_1d0;
      local_250.obj = &local_f0;
      cv::pyrDown(&local_270,(_OutputArray *)&local_250,(Size_ *)&local_200,4);
      cv::Mat::operator=(&local_1d0,&local_f0);
    }
    if (local_238 != (value_type *)0x0) {
      operator_delete(local_238);
    }
    cv::Mat::~Mat(&local_90);
  } while (bVar3 && bVar6);
  std::vector<ary::KeypointPlaneModel,_std::allocator<ary::KeypointPlaneModel>_>::push_back
            (&local_258->models,&local_170);
  cv::Mat::~Mat(&local_f0);
  cv::Mat::~Mat(&local_1d0);
  KeypointPlaneModel::~KeypointPlaneModel(&local_170);
  return true;
}

Assistant:

bool KeypointPlaneLocalizer::add(const Mat& image, float size) {

	KeypointPlaneModel model;

	Mat tmp_image1, tmp_image2;
	tmp_image1 = image;

	model.size = Size2f(tmp_image1.size().width * size, tmp_image1.size().height * size);

	while (true) {
		Mat descriptors;
		vector<KeyPoint> keypoints;

		detector->detect(tmp_image1, keypoints);
		detector->compute(tmp_image1, keypoints, descriptors);
		//descriptors.convertTo(descriptors, CV_32F);

		Size size = tmp_image1.size();
		if (model.descriptors.empty()) {
			descriptors.copyTo(model.descriptors);
		} else {
			vconcat(model.descriptors, descriptors, model.descriptors);
		}

		float xscale = (float) model.size.width / (float) size.width;
		float yscale = (float) model.size.height / (float) size.height;

		for (vector<KeyPoint>::iterator it = keypoints.begin(); it != keypoints.end(); it++) {
			(*it).pt.x *= xscale;
			(*it).pt.y *= yscale;
			model.keypoints.push_back(*it);
		}

		if (type == AKAZE) break; // No need for additional features.

		if (size.width * size.height < 30000) break;

		pyrDown(tmp_image1, tmp_image2, Size());
		tmp_image1 = tmp_image2;
	}

	models.push_back(model);

	return true;
}